

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade.c
# Opt level: O2

int fade_segment_mix(mixed_segment *segment)

{
  undefined8 *puVar1;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float *pfVar4;
  uint uVar5;
  code *pcVar6;
  uint32_t i;
  ulong uVar7;
  uint32_t i_1;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint32_t samples;
  double local_70;
  float local_68;
  float local_64;
  double local_60;
  float *in;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float *local_30;
  
  puVar1 = (undefined8 *)segment->data;
  local_68 = *(float *)(puVar1 + 2);
  uVar5 = *(int *)((long)puVar1 + 0x1c) - 2;
  local_60 = (double)CONCAT44(local_60._4_4_,*(undefined4 *)(puVar1 + 3));
  if (uVar5 < 3) {
    pcVar6 = (code *)(&PTR_fade_cubic_in_002b6850)[uVar5];
  }
  else {
    pcVar6 = fade_linear;
  }
  local_70 = (double)*(float *)((long)puVar1 + 0x24);
  samples = 0xffffffff;
  local_64 = *(float *)((long)puVar1 + 0x14) - local_68;
  local_50 = (double)(1.0 / (float)*(uint *)(puVar1 + 4));
  buffer = (mixed_buffer *)*puVar1;
  buffer_00 = (mixed_buffer *)puVar1[1];
  mixed_buffer_request_read(&in,&samples,buffer);
  pfVar4 = in;
  local_60 = (double)local_60._0_4_;
  if (buffer == buffer_00) {
    local_48 = 0x3ff0000000000000;
    uStack_40 = 0x3ff0000000000000;
    for (uVar7 = 0; uVar7 < samples; uVar7 = uVar7 + 1) {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_70;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_60;
      auVar11._0_8_ = local_70 / local_60;
      auVar11._8_8_ = 0;
      auVar14 = vcmpsd_avx(auVar16,auVar14,1);
      auVar3._8_8_ = uStack_40;
      auVar3._0_8_ = local_48;
      auVar14 = vblendvpd_avx(auVar3,auVar11,auVar14);
      auVar12._0_4_ = (float)auVar14._0_8_;
      auVar12._4_12_ = auVar14._4_12_;
      fVar8 = (float)(*pcVar6)(auVar12._0_8_);
      pfVar4[uVar7] = (fVar8 * local_64 + local_68) * in[uVar7];
      local_70 = local_70 + local_50;
    }
  }
  else {
    mixed_buffer_request_write(&local_30,&samples,buffer_00);
    uVar7 = 0;
    local_48 = 0x3ff0000000000000;
    uStack_40 = 0x3ff0000000000000;
    while( true ) {
      if (samples <= uVar7) break;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_70;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_60;
      auVar9._0_8_ = local_70 / local_60;
      auVar9._8_8_ = 0;
      auVar14 = vcmpsd_avx(auVar15,auVar13,1);
      auVar2._8_8_ = uStack_40;
      auVar2._0_8_ = local_48;
      auVar14 = vblendvpd_avx(auVar2,auVar9,auVar14);
      auVar10._0_4_ = (float)auVar14._0_8_;
      auVar10._4_12_ = auVar14._4_12_;
      fVar8 = (float)(*pcVar6)(auVar10._0_8_);
      local_30[uVar7] = (fVar8 * local_64 + local_68) * in[uVar7];
      local_70 = local_70 + local_50;
      uVar7 = uVar7 + 1;
    }
    mixed_buffer_finish_read(samples,buffer);
    mixed_buffer_finish_write(samples,buffer_00);
  }
  *(float *)((long)puVar1 + 0x24) = (float)local_70;
  return 1;
}

Assistant:

VECTORIZE int fade_segment_mix(struct mixed_segment *segment){
  struct fade_segment_data *data = (struct fade_segment_data *)segment->data;

  double time = data->time_passed;
  float endtime = data->time;
  float from = data->from;
  float range = data->to - data->from;
  double sampletime = 1.0f/data->samplerate;
  
  float (*ease)(float x);
  switch(data->type){
  case MIXED_LINEAR: ease = fade_linear; break;
  case MIXED_CUBIC_IN: ease = fade_cubic_in; break;
  case MIXED_CUBIC_OUT: ease = fade_cubic_out; break;
  case MIXED_CUBIC_IN_OUT: ease = fade_cubic_in_out; break;
  default: ease = fade_linear; break;
  }
  
  // NOTE: You could probably get away with having the same fade factor
  //       for the entirety of the sample range if the total duration
  //       of the buffer is small enough (~1ms?) as the human ear
  //       wouldn't be able to properly notice it.
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float x = (time < endtime)? time/endtime : 1.0f;
      float fade = from+ease(x)*range;
      out[i] = in[i]*fade;
      time += sampletime;
    });
  data->time_passed = time;
  return 1;
}